

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

type_caster<long,_void> *
pybind11::detail::load_type<long,void>(type_caster<long,_void> *conv,handle *handle)

{
  bool bVar1;
  cast_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  str local_30;
  allocator<char> local_21;
  
  bVar1 = type_caster<long,_void>::load(conv,(handle)handle->m_ptr,true);
  if (bVar1) {
    return conv;
  }
  this = (cast_error *)__cxa_allocate_exception(0x10);
  pybind11::str::str(&local_30,(PyObject *)handle->m_ptr->ob_type);
  pybind11::str::operator_cast_to_string(&local_70,&local_30);
  std::operator+(&local_90,"Unable to cast Python instance of type ",&local_70);
  std::operator+(&local_b0,&local_90," to C++ type \'");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,__exception + (*__exception == '*'),&local_21);
  clean_type_id(&local_50);
  std::operator+(&local_d0,&local_b0,&local_50);
  std::operator+(&local_f0,&local_d0,"\'");
  cast_error::runtime_error(this,&local_f0);
  __cxa_throw(this,&cast_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

type_caster<T, SFINAE> &load_type(type_caster<T, SFINAE> &conv, const handle &handle) {
    if (!conv.load(handle, true)) {
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ type (compile in debug mode for details)");
#else
        throw cast_error("Unable to cast Python instance of type " +
            (std::string) str(type::handle_of(handle)) + " to C++ type '" + type_id<T>() + "'");
#endif
    }
    return conv;
}